

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinger.c
# Opt level: O3

void pinger_schedule(Pinger *pinger)

{
  unsigned_long uVar1;
  
  if (pinger->interval == 0) {
    pinger->pending = false;
  }
  else {
    uVar1 = schedule_timer(pinger->interval * 1000,pinger_timer,pinger);
    if ((pinger->pending != true) || (uVar1 - pinger->when_set < pinger->next - pinger->when_set)) {
      pinger->next = uVar1;
      uVar1 = timing_last_clock();
      pinger->when_set = uVar1;
      pinger->pending = true;
    }
  }
  return;
}

Assistant:

static void pinger_schedule(Pinger *pinger)
{
    unsigned long next;

    if (!pinger->interval) {
        pinger->pending = false;       /* cancel any pending ping */
        return;
    }

    next = schedule_timer(pinger->interval * TICKSPERSEC,
                          pinger_timer, pinger);
    if (!pinger->pending ||
        (next - pinger->when_set) < (pinger->next - pinger->when_set)) {
        pinger->next = next;
        pinger->when_set = timing_last_clock();
        pinger->pending = true;
    }
}